

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O0

void shm::gen_key(shm_key_t *key,int proj_id)

{
  int iVar1;
  result_type rVar2;
  uint uVar3;
  char local_48 [8];
  shm_key_t val_key;
  result_type_conflict1 val;
  int proj_id_local;
  shm_key_t *key_local;
  
  if (gen_key(char&[],int)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&gen_key(char&[],int)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&gen_key::rd);
      __cxa_atexit(std::random_device::~random_device,&gen_key::rd,&__dso_handle);
      __cxa_guard_release(&gen_key(char&[],int)::rd);
    }
  }
  if (gen_key(char&[],int)::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&gen_key(char&[],int)::gen);
    if (iVar1 != 0) {
      rVar2 = std::random_device::operator()(&gen_key::rd);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine(&gen_key::gen,(ulong)rVar2);
      __cxa_guard_release(&gen_key(char&[],int)::gen);
    }
  }
  if (gen_key(char&[],int)::distrib == '\0') {
    iVar1 = __cxa_guard_acquire(&gen_key(char&[],int)::distrib);
    if (iVar1 != 0) {
      iVar1 = std::numeric_limits<int>::max();
      std::uniform_int_distribution<int>::uniform_int_distribution(&gen_key::distrib,0,iVar1);
      __cxa_guard_release(&gen_key(char&[],int)::distrib);
    }
  }
  uVar3 = std::uniform_int_distribution<int>::operator()(&gen_key::distrib,&gen_key::gen);
  memset(local_48,0,0x18);
  snprintf(local_48,0x18,"%d",(ulong)uVar3);
  key_copy(key,local_48);
  return;
}

Assistant:

void 
shm::gen_key( shm_key_t &key, const int proj_id )
{
#if _USE_POSIX_SHM_ == 1
    //string key
    UNUSED( proj_id );
    static std::random_device rd;
    static std::mt19937 gen( rd() );
    static std::uniform_int_distribution<> distrib( 0, std::numeric_limits< int >::max() );
    const auto val = distrib( gen );
    shm_key_t val_key;
    std::memset(    val_key, 
                    '\0', 
                    shm_key_length );

    std::snprintf( val_key, 
                   shm_key_length,
                   "%d",
                   val );

    shm::key_copy( key, val_key );
    return;
#elif _USE_SYSTEMV_SHM_ == 1
    //integer key
    char *path = getcwd( nullptr, 0 );
    if( path == nullptr )
    {
        std::perror( "failed to get cwd, switching to guns, a.k.a. root dir (/)" );
        key = ftok( "/", proj_id);
    }
    else
    {
        key = ftok( path, proj_id);
    }
    return;
#endif
}